

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O2

Section * out_OverlappingSection(Section *section)

{
  ushort uVar1;
  SortedSection *pSVar2;
  Section *pSVar3;
  SortedSections *pSVar4;
  uint uVar5;
  
  pSVar4 = sections[section->type].banks +
           (section->bank - sectionTypeInfo[section->type].firstBank);
  while( true ) {
    pSVar2 = pSVar4->sections;
    if (pSVar2 == (SortedSection *)0x0) {
      return (Section *)0x0;
    }
    pSVar3 = pSVar2->section;
    uVar1 = section->org;
    if (((uint)pSVar3->org < (uint)section->size + (uint)uVar1) &&
       (uVar5 = (uint)pSVar3->size + (uint)pSVar3->org, uVar1 <= uVar5 && uVar5 != uVar1)) break;
    pSVar4 = (SortedSections *)&pSVar2->next;
  }
  return pSVar3;
}

Assistant:

struct Section const *out_OverlappingSection(struct Section const *section)
{
	struct SortedSections *banks = sections[section->type].banks;
	struct SortedSection *ptr =
		banks[section->bank - sectionTypeInfo[section->type].firstBank].sections;

	while (ptr) {
		if (ptr->section->org < section->org + section->size
		 && section->org < ptr->section->org + ptr->section->size)
			return ptr->section;
		ptr = ptr->next;
	}
	return NULL;
}